

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small.c
# Opt level: O2

void small_stats(small_alloc *alloc,small_stats *totals,_func_int_void_ptr_void_ptr *cb,void *cb_ctx
                )

{
  int iVar1;
  ulong uVar2;
  mempool *pool;
  undefined1 local_60 [8];
  mempool_stats stats;
  
  totals->used = 0;
  totals->total = 0;
  uVar2 = 0xffffffffffffffff;
  pool = &alloc->small_mempool_cache[0].pool;
  stats.totals.total = (size_t)cb_ctx;
  do {
    uVar2 = uVar2 + 1;
    if (alloc->small_mempool_cache_size <= uVar2) {
      return;
    }
    mempool_stats(pool,(mempool_stats *)local_60);
    totals->used = totals->used + stats._8_8_;
    totals->total = totals->total + stats.totals.used;
    iVar1 = (*cb)((mempool_stats *)local_60,(void *)stats.totals.total);
    pool = (mempool *)&pool[1].hot_slabs;
  } while (iVar1 == 0);
  return;
}

Assistant:

void
small_stats(struct small_alloc *alloc,
	    struct small_stats *totals,
	    int (*cb)(const void *, void *), void *cb_ctx)
{
	memset(totals, 0, sizeof(*totals));

	struct mempool_iterator it;
	mempool_iterator_create(&it, alloc);
	struct mempool *pool;

	while ((pool = mempool_iterator_next(&it))) {
		struct mempool_stats stats;
		mempool_stats(pool, &stats);
		totals->used += stats.totals.used;
		totals->total += stats.totals.total;
		if (cb(&stats, cb_ctx))
			break;
	}
}